

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O1

void absorb_plaintext(ascon_sponge_t *sponge,uint8_t *ciphertext,uint8_t *plaintext)

{
  uint64_t uVar1;
  
  uVar1 = bigendian_decode_u64(plaintext);
  sponge->x0 = sponge->x0 ^ uVar1;
  uVar1 = bigendian_decode_u64(plaintext + 8);
  sponge->x1 = sponge->x1 ^ uVar1;
  bigendian_encode_u64(ciphertext,sponge->x0);
  bigendian_encode_u64(ciphertext + 8,sponge->x1);
  ascon_permutation_8(sponge);
  return;
}

Assistant:

static void
absorb_plaintext(ascon_sponge_t* const sponge,
                 uint8_t* const ciphertext,
                 const uint8_t* const plaintext)
{
    // Absorb the plaintext.
    sponge->x0 ^= bigendian_decode_u64(plaintext);
    sponge->x1 ^= bigendian_decode_u64(plaintext + ASCON_RATE);
    // Squeeze out some ciphertext
    bigendian_encode_u64(ciphertext, sponge->x0);
    bigendian_encode_u64(ciphertext + ASCON_RATE, sponge->x1);
    // Permute the state
    ascon_permutation_8(sponge);
}